

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

int av1_set_reference_enc(AV1_COMP *cpi,int idx,YV12_BUFFER_CONFIG *sd)

{
  RefCntBuffer *pRVar1;
  int iVar2;
  
  iVar2 = -1;
  if (((uint)idx < 8) &&
     (pRVar1 = (cpi->common).ref_frame_map[(uint)idx], pRVar1 != (RefCntBuffer *)0x0)) {
    aom_yv12_copy_frame_c
              (sd,&pRVar1->buf,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int av1_set_reference_enc(AV1_COMP *cpi, int idx, YV12_BUFFER_CONFIG *sd) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  YV12_BUFFER_CONFIG *cfg = get_ref_frame(cm, idx);
  if (cfg) {
    aom_yv12_copy_frame(sd, cfg, num_planes);
    return 0;
  } else {
    return -1;
  }
}